

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O0

LY_ERR lysp_stmt_type_reqinstance
                 (lysp_ctx *ctx,lysp_stmt *stmt,uint8_t *reqinst,uint16_t *flags,
                 lysp_ext_instance **exts)

{
  int iVar1;
  LY_ERR LVar2;
  size_t sVar3;
  char *pcVar4;
  ly_ctx *local_68;
  ly_ctx *local_60;
  ly_ctx *local_58;
  lysp_stmt *plStack_48;
  LY_ERR ret___1;
  lysp_stmt *child;
  LY_ERR ret__;
  int arg_len;
  lysp_ext_instance **exts_local;
  uint16_t *flags_local;
  uint8_t *reqinst_local;
  lysp_stmt *stmt_local;
  lysp_ctx *ctx_local;
  
  if ((*flags & 0x200) == 0) {
    *flags = *flags | 0x200;
    ctx_local._4_4_ = lysp_stmt_validate_value(ctx,Y_STR_ARG,stmt->arg);
    if (ctx_local._4_4_ == LY_SUCCESS) {
      sVar3 = strlen(stmt->arg);
      if (((int)sVar3 == 4) && (iVar1 = strncmp(stmt->arg,"true",4), iVar1 == 0)) {
        *reqinst = '\x01';
      }
      else if (((int)sVar3 != 5) || (iVar1 = strncmp(stmt->arg,"false",5), iVar1 != 0)) {
        if (ctx == (lysp_ctx *)0x0) {
          local_60 = (ly_ctx *)0x0;
        }
        else {
          local_60 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        ly_vlog(local_60,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
                sVar3 & 0xffffffff,stmt->arg,"require-instance");
        return LY_EVALID;
      }
      for (plStack_48 = stmt->child; plStack_48 != (lysp_stmt *)0x0; plStack_48 = plStack_48->next)
      {
        if (plStack_48->kw != LY_STMT_EXTENSION_INSTANCE) {
          if (ctx == (lysp_ctx *)0x0) {
            local_68 = (ly_ctx *)0x0;
          }
          else {
            local_68 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          pcVar4 = lyplg_ext_stmt2str(plStack_48->kw);
          ly_vlog(local_68,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\" as a child of \"%s\".",pcVar4,"require-instance");
          return LY_EVALID;
        }
        LVar2 = lysp_stmt_ext(ctx,plStack_48,LY_STMT_REQUIRE_INSTANCE,0,exts);
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
      }
      ctx_local._4_4_ = LY_SUCCESS;
    }
  }
  else {
    if (ctx == (lysp_ctx *)0x0) {
      local_58 = (ly_ctx *)0x0;
    }
    else {
      local_58 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(local_58,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".","require-instance");
    ctx_local._4_4_ = LY_EVALID;
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lysp_stmt_type_reqinstance(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, uint8_t *reqinst, uint16_t *flags,
        struct lysp_ext_instance **exts)
{
    int arg_len;

    if (*flags & LYS_SET_REQINST) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "require-instance");
        return LY_EVALID;
    }
    *flags |= LYS_SET_REQINST;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_STR_ARG, stmt->arg));
    arg_len = strlen(stmt->arg);
    if ((arg_len == ly_strlen_const("true")) && !strncmp(stmt->arg, "true", arg_len)) {
        *reqinst = 1;
    } else if ((arg_len != ly_strlen_const("false")) || strncmp(stmt->arg, "false", arg_len)) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, arg_len, stmt->arg, "require-instance");
        return LY_EVALID;
    }

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_REQUIRE_INSTANCE, 0, exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "require-instance");
            return LY_EVALID;
        }
    }
    return LY_SUCCESS;
}